

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void cvarfunc_menu_screenratios(FIntCVar *self)

{
  int in_EDX;
  
  if (self->Value - 7U < 0xfffffff8) {
    FIntCVar::operator=(self,-1);
    return;
  }
  if ((self->Value == 4) && (!vid_tft.Value)) {
    FIntCVar::operator=(self,0);
    return;
  }
  BuildModesList(screen->VideoWidth,screen->VideoHeight,in_EDX);
  return;
}

Assistant:

inline operator int () const { return Value; }